

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int codeAllEqualityTerms
              (Parse *pParse,WhereLevel *pLevel,WhereClause *pWC,Bitmask notReady,int nExtraReg,
              char **pzAff)

{
  byte bVar1;
  ushort uVar2;
  int iCur;
  sqlite3 *db;
  Vdbe *v;
  Index *pIdx;
  Expr *pExpr;
  int iVar3;
  char cVar4;
  int p1;
  int iVar5;
  char *pcVar6;
  WhereTerm *pTerm;
  long lVar7;
  int iVar8;
  int iTarget;
  ulong uVar9;
  
  uVar2 = (pLevel->plan).nEq;
  db = pParse->db;
  v = pParse->pVdbe;
  iCur = pLevel->iTabCur;
  pIdx = (pLevel->plan).u.pIdx;
  iVar8 = pParse->nMem;
  pParse->nMem = nExtraReg + (uint)uVar2 + iVar8;
  pcVar6 = sqlite3IndexAffinityStr(v,pIdx);
  pcVar6 = sqlite3DbStrDup(db,pcVar6);
  if (pcVar6 == (char *)0x0) {
    pParse->db->mallocFailed = '\x01';
  }
  iVar8 = iVar8 + 1;
  if ((ulong)uVar2 != 0) {
    uVar9 = 0;
    do {
      pTerm = findTerm(pWC,iCur,pIdx->aiColumn[uVar9],notReady,(pLevel->plan).wsFlags,pIdx);
      if (pTerm != (WhereTerm *)0x0) {
        iVar5 = (int)uVar9;
        iTarget = iVar5 + iVar8;
        p1 = codeEqualityTerm(pParse,pTerm,pLevel,iVar5,iTarget);
        iVar3 = iVar8;
        if (p1 != iTarget) {
          if (nExtraReg + (uint)uVar2 == 1) {
            iVar3 = p1;
            if (iVar8 != 0) {
              bVar1 = pParse->nTempReg;
              if ((ulong)bVar1 < 8) {
                lVar7 = 0;
                do {
                  if (*(int *)((long)&pParse->aColCache[0].iReg + lVar7) == iVar8) {
                    (&pParse->aColCache[0].tempReg)[lVar7] = '\x01';
                    goto LAB_00198e5a;
                  }
                  lVar7 = lVar7 + 0x18;
                } while ((int)lVar7 != 0xf0);
                pParse->nTempReg = bVar1 + 1;
                pParse->aTempReg[bVar1] = iVar8;
              }
            }
          }
          else {
            sqlite3VdbeAddOp3(v,0xf,p1,iTarget,0);
          }
        }
LAB_00198e5a:
        iVar8 = iVar3;
        if ((pTerm->eOperator & 0x81) == 0) {
          pExpr = pTerm->pExpr->pRight;
          sqlite3ExprCodeIsNullJump(v,pExpr,iVar8 + iVar5,pLevel->addrBrk);
          if (pcVar6 != (char *)0x0) {
            cVar4 = sqlite3CompareAffinity(pExpr,pcVar6[uVar9]);
            if (cVar4 == 'b') {
              pcVar6[uVar9] = 'b';
            }
            iVar5 = sqlite3ExprNeedsNoAffinityChange(pExpr,pcVar6[uVar9]);
            if (iVar5 != 0) {
              pcVar6[uVar9] = 'b';
            }
          }
        }
      }
    } while ((pTerm != (WhereTerm *)0x0) && (uVar9 = uVar9 + 1, uVar9 != uVar2));
  }
  *pzAff = pcVar6;
  return iVar8;
}

Assistant:

static int codeAllEqualityTerms(
  Parse *pParse,        /* Parsing context */
  WhereLevel *pLevel,   /* Which nested loop of the FROM we are coding */
  WhereClause *pWC,     /* The WHERE clause */
  Bitmask notReady,     /* Which parts of FROM have not yet been coded */
  int nExtraReg,        /* Number of extra registers to allocate */
  char **pzAff          /* OUT: Set to point to affinity string */
){
  int nEq = pLevel->plan.nEq;   /* The number of == or IN constraints to code */
  Vdbe *v = pParse->pVdbe;      /* The vm under construction */
  Index *pIdx;                  /* The index being used for this loop */
  int iCur = pLevel->iTabCur;   /* The cursor of the table */
  WhereTerm *pTerm;             /* A single constraint term */
  int j;                        /* Loop counter */
  int regBase;                  /* Base register */
  int nReg;                     /* Number of registers to allocate */
  char *zAff;                   /* Affinity string to return */

  /* This module is only called on query plans that use an index. */
  assert( pLevel->plan.wsFlags & WHERE_INDEXED );
  pIdx = pLevel->plan.u.pIdx;

  /* Figure out how many memory cells we will need then allocate them.
  */
  regBase = pParse->nMem + 1;
  nReg = pLevel->plan.nEq + nExtraReg;
  pParse->nMem += nReg;

  zAff = sqlite3DbStrDup(pParse->db, sqlite3IndexAffinityStr(v, pIdx));
  if( !zAff ){
    pParse->db->mallocFailed = 1;
  }

  /* Evaluate the equality constraints
  */
  assert( pIdx->nColumn>=nEq );
  for(j=0; j<nEq; j++){
    int r1;
    int k = pIdx->aiColumn[j];
    pTerm = findTerm(pWC, iCur, k, notReady, pLevel->plan.wsFlags, pIdx);
    if( pTerm==0 ) break;
    /* The following true for indices with redundant columns. 
    ** Ex: CREATE INDEX i1 ON t1(a,b,a); SELECT * FROM t1 WHERE a=0 AND b=0; */
    testcase( (pTerm->wtFlags & TERM_CODED)!=0 );
    testcase( pTerm->wtFlags & TERM_VIRTUAL ); /* EV: R-30575-11662 */
    r1 = codeEqualityTerm(pParse, pTerm, pLevel, j, regBase+j);
    if( r1!=regBase+j ){
      if( nReg==1 ){
        sqlite3ReleaseTempReg(pParse, regBase);
        regBase = r1;
      }else{
        sqlite3VdbeAddOp2(v, OP_SCopy, r1, regBase+j);
      }
    }
    testcase( pTerm->eOperator & WO_ISNULL );
    testcase( pTerm->eOperator & WO_IN );
    if( (pTerm->eOperator & (WO_ISNULL|WO_IN))==0 ){
      Expr *pRight = pTerm->pExpr->pRight;
      sqlite3ExprCodeIsNullJump(v, pRight, regBase+j, pLevel->addrBrk);
      if( zAff ){
        if( sqlite3CompareAffinity(pRight, zAff[j])==SQLITE_AFF_NONE ){
          zAff[j] = SQLITE_AFF_NONE;
        }
        if( sqlite3ExprNeedsNoAffinityChange(pRight, zAff[j]) ){
          zAff[j] = SQLITE_AFF_NONE;
        }
      }
    }
  }
  *pzAff = zAff;
  return regBase;
}